

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

string * __thiscall DataStream::str_abi_cxx11_(string *__return_storage_ptr__,DataStream *this)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_type sVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar4 = this->m_read_pos;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<unsigned_char_const*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,pbVar2 + sVar4,pbVar3);
}

Assistant:

std::string str() const
    {
        return std::string{UCharCast(data()), UCharCast(data() + size())};
    }